

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O3

bool __thiscall
burst::
semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
::equal(semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
        *this,semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
              *that)

{
  iterator_range<const_int_*> *__first1;
  iterator_range<const_int_*> *__first2;
  iterator_range<const_int_*> *__last1;
  bool bVar1;
  
  __first1 = (this->m_begin)._M_current;
  __first2 = (that->m_begin)._M_current;
  if (__first1 != __first2) {
    __assert_fail("this->m_begin == that.m_begin",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/semiintersect_iterator.hpp"
                  ,0x147,
                  "bool burst::semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const int *> *, std::vector<boost::iterator_range<const int *>>>>::equal(const semiintersect_iterator<RandomAccessIterator, Compare> &) const [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::iterator_range<const int *> *, std::vector<boost::iterator_range<const int *>>>, Compare = std::less<void>]"
                 );
  }
  __last1 = (this->m_end)._M_current;
  if (__last1 != (that->m_end)._M_current) {
    return false;
  }
  bVar1 = std::__equal<false>::
          equal<boost::iterator_range<int_const*>*,boost::iterator_range<int_const*>*>
                    (__first1,__last1,__first2);
  return bVar1;
}

Assistant:

bool equal (const semiintersect_iterator & that) const
        {
            assert(this->m_begin == that.m_begin);
            return std::equal(this->m_begin, this->m_end, that.m_begin, that.m_end);
        }